

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FpgaIO.cpp
# Opt level: O2

bool __thiscall FpgaIO::ReadEthernetData(FpgaIO *this,quadlet_t *buffer,uint offset,uint nquads)

{
  uint uVar1;
  BasePort *pBVar2;
  bool bVar3;
  uint32_t uVar4;
  int iVar5;
  ulong uVar6;
  
  uVar4 = BoardIO::GetFirmwareVersion(&this->super_BoardIO);
  bVar3 = false;
  if ((nquads < 0x41) && (4 < uVar4)) {
    pBVar2 = (this->super_BoardIO).port;
    iVar5 = (*pBVar2->_vptr_BasePort[0x26])
                      (pBVar2,(ulong)(this->super_BoardIO).BoardId,(ulong)(offset + 0x4000),buffer,
                       (ulong)(nquads * 4));
    if ((char)iVar5 == '\0') {
      bVar3 = false;
    }
    else {
      for (uVar6 = 0; nquads != uVar6; uVar6 = uVar6 + 1) {
        uVar1 = buffer[uVar6];
        buffer[uVar6] =
             uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
      }
      bVar3 = true;
    }
  }
  return bVar3;
}

Assistant:

bool FpgaIO::ReadEthernetData(quadlet_t *buffer, unsigned int offset, unsigned int nquads)
{
    if (GetFirmwareVersion() < 5) return false;
    // Firmware currently cannot read more than 64 quadlets
    if (nquads > 64) return false;
    nodeaddr_t address = 0x4000 + offset;   // ADDR_ETH = 0x4000
    bool ret = port->ReadBlock(BoardId, address, buffer, nquads*sizeof(quadlet_t));
    if (ret) {
        for (unsigned int i = 0; i < nquads; i++)
            buffer[i] = bswap_32(buffer[i]);
    }
    return ret;
}